

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O2

DdNode * Cudd_addXeqy(DdManager *dd,int N,DdNode **x,DdNode **y)

{
  int *piVar1;
  DdNode *h;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  uint uVar5;
  long lVar6;
  
  pDVar4 = dd->one;
  h = dd->zero;
  pDVar2 = Cudd_addIte(dd,y[(long)N + -1],pDVar4,h);
  if (pDVar2 != (DdNode *)0x0) {
    lVar6 = (long)N + -1;
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar3 = Cudd_addIte(dd,y[lVar6],h,pDVar4);
    pDVar4 = pDVar2;
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = Cudd_addIte(dd,x[lVar6],pDVar2,pDVar3);
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar2);
        pDVar4 = pDVar3;
      }
      else {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar2);
        Cudd_RecursiveDeref(dd,pDVar3);
        uVar5 = N - 2;
        while( true ) {
          if ((int)uVar5 < 0) {
            piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            return pDVar4;
          }
          pDVar2 = Cudd_addIte(dd,y[uVar5],pDVar4,h);
          if (pDVar2 == (DdNode *)0x0) goto LAB_00620803;
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar3 = Cudd_addIte(dd,y[uVar5],h,pDVar4);
          if (pDVar3 == (DdNode *)0x0) break;
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,pDVar4);
          pDVar4 = Cudd_addIte(dd,x[uVar5],pDVar2,pDVar3);
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,pDVar2);
          Cudd_RecursiveDeref(dd,pDVar3);
          uVar5 = uVar5 - 1;
        }
        Cudd_RecursiveDeref(dd,pDVar4);
        pDVar4 = pDVar2;
      }
    }
LAB_00620803:
    Cudd_RecursiveDeref(dd,pDVar4);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addXeqy(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    DdNode *one, *zero;
    DdNode *u, *v, *w;
    int     i;

    one = DD_ONE(dd);
    zero = DD_ZERO(dd);

    /* Build bottom part of ADD outside loop. */
    v = Cudd_addIte(dd, y[N-1], one, zero);
    if (v == NULL) return(NULL);
    cuddRef(v);
    w = Cudd_addIte(dd, y[N-1], zero, one);
    if (w == NULL) {
        Cudd_RecursiveDeref(dd, v);
        return(NULL);
    }
    cuddRef(w);
    u = Cudd_addIte(dd, x[N-1], v, w);
    if (u == NULL) {
        Cudd_RecursiveDeref(dd, v);
        Cudd_RecursiveDeref(dd, w);
        return(NULL);
    }
    cuddRef(u);
    Cudd_RecursiveDeref(dd, v);
    Cudd_RecursiveDeref(dd, w);

    /* Loop to build the rest of the ADD. */
    for (i = N-2; i >= 0; i--) {
        v = Cudd_addIte(dd, y[i], u, zero);
        if (v == NULL) {
            Cudd_RecursiveDeref(dd, u);
            return(NULL);
        }
        cuddRef(v);
        w = Cudd_addIte(dd, y[i], zero, u);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, u);
            Cudd_RecursiveDeref(dd, v);
            return(NULL);
        }
        cuddRef(w);
        Cudd_RecursiveDeref(dd, u);
        u = Cudd_addIte(dd, x[i], v, w);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, v);
            Cudd_RecursiveDeref(dd, w);
            return(NULL);
        }
        cuddRef(u);
        Cudd_RecursiveDeref(dd, v);
        Cudd_RecursiveDeref(dd, w);
    }
    cuddDeref(u);
    return(u);

}